

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

int __thiscall MemoryLeakDetectorNode::init(MemoryLeakDetectorNode *this,EVP_PKEY_CTX *ctx)

{
  undefined4 in_EAX;
  size_t in_RCX;
  uint in_EDX;
  TestMemoryAllocator *in_R8;
  MemLeakPeriod in_R9D;
  uchar in_stack_00000008;
  char *in_stack_00000010;
  size_t in_stack_00000018;
  
  this->number_ = in_EDX;
  this->memory_ = (char *)ctx;
  this->size_ = in_RCX;
  this->allocator_ = in_R8;
  this->period_ = in_R9D;
  this->allocation_stage_ = in_stack_00000008;
  this->file_ = in_stack_00000010;
  this->line_ = in_stack_00000018;
  return CONCAT31((int3)((uint)in_EAX >> 8),in_stack_00000008);
}

Assistant:

void MemoryLeakDetectorNode::init(char* memory, unsigned number, size_t size, TestMemoryAllocator* allocator, MemLeakPeriod period, unsigned char allocation_stage, const char* file, size_t line)
{
    number_ = number;
    memory_ = memory;
    size_ = size;
    allocator_ = allocator;
    period_ = period;
    allocation_stage_ = allocation_stage;
    file_ = file;
    line_ = line;
}